

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

Vec_Ptr_t * Saig_ManGetRegistersToExclude(Aig_Man_t *p)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                  ,0x1be,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
  }
  uVar8 = p->nRegs;
  if (0 < (int)uVar8) {
    iVar5 = 0;
    do {
      uVar8 = p->nTruePos + iVar5;
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) goto LAB_006e8c44;
      uVar10 = *(ulong *)((long)p->vCos->pArray[uVar8] + 8);
      puVar1 = (ulong *)((uVar10 & 0xfffffffffffffffe) + 0x18);
      *puVar1 = *puVar1 | (ulong)(((uint)uVar10 & 1) << 4) + 0x10;
      iVar5 = iVar5 + 1;
      uVar8 = p->nRegs;
    } while (iVar5 < (int)uVar8);
  }
  if ((int)uVar8 < 1) {
    iVar5 = 0;
  }
  else {
    uVar10 = (ulong)(uint)p->nTruePos;
    uVar9 = (ulong)uVar8;
    iVar5 = 0;
    do {
      if ((p->nTruePos < 0) || (p->vCos->nSize <= (int)uVar10)) goto LAB_006e8c44;
      uVar3 = *(ulong *)((*(ulong *)((long)p->vCos->pArray[uVar10] + 8) & 0xfffffffffffffffe) + 0x18
                        );
      uVar8 = 0;
      if ((uVar3 & 0x10) != 0) {
        uVar8 = (uint)(uVar3 >> 5) & 1;
      }
      iVar5 = iVar5 + uVar8;
      uVar10 = uVar10 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  if (iVar5 != 0) {
    if (0 < p->nRegs) {
      iVar12 = 0;
      do {
        uVar8 = p->nTruePos + iVar12;
        if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) goto LAB_006e8c44;
        pvVar4 = p->vCos->pArray[uVar8];
        if ((~*(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) & 0x30) == 0) {
          uVar8 = pVVar6->nSize;
          uVar2 = pVVar6->nCap;
          if (uVar8 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
              }
              iVar11 = 0x10;
            }
            else {
              iVar11 = uVar2 * 2;
              if (iVar11 <= (int)uVar2) goto LAB_006e8bcb;
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
              }
            }
            pVVar6->pArray = ppvVar7;
            pVVar6->nCap = iVar11;
          }
LAB_006e8bcb:
          pVVar6->nSize = uVar8 + 1;
          pVVar6->pArray[(int)uVar8] = pvVar4;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < p->nRegs);
    }
    if (pVVar6->nSize != iVar5) {
      __assert_fail("Vec_PtrSize(vNodes) == Diffs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1d6,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
    }
  }
  if (0 < p->nRegs) {
    iVar5 = 0;
    do {
      uVar8 = p->nTruePos + iVar5;
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) {
LAB_006e8c44:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)p->vCos->pArray[uVar8] + 8) & 0xfffffffffffffffe) + 0x18)
      ;
      *puVar1 = *puVar1 & 0xffffffffffffffcf;
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Saig_ManGetRegistersToExclude( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, Diffs;
    assert( Saig_ManRegNum(p) > 0 );
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( !Aig_ObjFaninC0(pObj) )
            pFanin->fMarkA = 1;
        else
            pFanin->fMarkB = 1;
    }
    Diffs = 0;
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
    }
    vNodes = Vec_PtrAlloc( 100 );
    if ( Diffs > 0 )
    {
        Saig_ManForEachLi( p, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            if ( pFanin->fMarkA && pFanin->fMarkB )
                Vec_PtrPush( vNodes, pObj );
        }
        assert( Vec_PtrSize(vNodes) == Diffs );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vNodes;
}